

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall string_view_find_first_of3_Test::TestBody(string_view_find_first_of3_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_110;
  Message local_108;
  string_view local_100;
  size_type local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  Message local_d0;
  string_view local_c8;
  size_type local_b8;
  uint local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  string_view local_88;
  size_type local_78;
  undefined4 local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_50;
  Message local_48;
  string_view local_40;
  size_type local_30;
  undefined4 local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  string_view_find_first_of3_Test *this_local;
  
  local_24 = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  wabt::string_view::string_view(&local_40,"0123abc");
  local_30 = wabt::string_view::find_first_of(&local_40,"0a",0);
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
            (local_20,"0U",(uint *)"string_view(\"0123abc\").find_first_of(\"0a\")",
             (unsigned_long *)&local_24,&local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(&local_48);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_6c = 0;
    wabt::string_view::string_view(&local_88,"0123abc");
    local_78 = wabt::string_view::find_first_of(&local_88,"0a",0);
    testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
              (local_68,"0U",(uint *)"string_view(\"0123abc\").find_first_of(\"0a\", 0)",
               (unsigned_long *)&local_6c,&local_78);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                 ,0x159,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_90);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_ac = 4;
      wabt::string_view::string_view(&local_c8,"0123abc");
      local_b8 = wabt::string_view::find_first_of(&local_c8,"0a",1);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_a8,"4U",
                 "string_view(\"0123abc\").find_first_of(\"0a\", 1)",&local_ac,&local_b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
      if (!bVar1) {
        testing::Message::Message(&local_d0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                   ,0x15a,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_d0);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        wabt::string_view::string_view(&local_100,"0123abc");
        local_f0 = wabt::string_view::find_first_of(&local_100,"0a",5);
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_e8,"npos",
                   "string_view(\"0123abc\").find_first_of(\"0a\", 5)",&(anonymous_namespace)::npos,
                   &local_f0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
        if (!bVar1) {
          testing::Message::Message(&local_108);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                     ,0x15b,pcVar2);
          testing::internal::AssertHelper::operator=(&local_110,&local_108);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          testing::Message::~Message(&local_108);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
      }
    }
  }
  return;
}

Assistant:

TEST(string_view, find_first_of3) {
  ASSERT_EQ(0U, string_view("0123abc").find_first_of("0a"));
  ASSERT_EQ(0U, string_view("0123abc").find_first_of("0a", 0));
  ASSERT_EQ(4U, string_view("0123abc").find_first_of("0a", 1));
  ASSERT_EQ(npos, string_view("0123abc").find_first_of("0a", 5));
}